

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_cast.cpp
# Opt level: O1

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::MapBoundCastData::BindMapToMapCast
          (MapBoundCastData *this,BindCastInput *input,LogicalType *source,LogicalType *target)

{
  LogicalType *pLVar1;
  _func_int **pp_Var2;
  BoundCastInfo value_cast;
  BoundCastInfo key_cast;
  vector<duckdb::BoundCastInfo,_true> child_cast_info;
  LogicalType target_val;
  LogicalType source_val;
  LogicalType target_key;
  LogicalType source_key;
  BoundCastInfo local_d8;
  BoundCastInfo local_c0;
  vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  GetCastFunctionInput local_30;
  
  local_a8.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar1 = MapType::KeyType(source);
  LogicalType::LogicalType(&local_48,pLVar1);
  pLVar1 = MapType::KeyType(target);
  LogicalType::LogicalType(&local_60,pLVar1);
  pLVar1 = MapType::ValueType(source);
  LogicalType::LogicalType(&local_78,pLVar1);
  pLVar1 = MapType::ValueType(target);
  LogicalType::LogicalType(&local_90,pLVar1);
  local_d8.function = (cast_function_t)(input->context).ptr;
  local_d8.init_local_state = (init_cast_local_state_t)(input->query_location).index;
  CastFunctionSet::GetCastFunction
            (&local_c0,input->function_set,&local_48,&local_60,(GetCastFunctionInput *)&local_d8);
  local_30.context.ptr = (input->context).ptr;
  local_30.query_location.index = (input->query_location).index;
  CastFunctionSet::GetCastFunction(&local_d8,input->function_set,&local_78,&local_90,&local_30);
  pp_Var2 = (_func_int **)operator_new(0x38);
  pp_Var2[1] = (_func_int *)local_c0.function;
  pp_Var2[2] = (_func_int *)local_c0.init_local_state;
  *(undefined4 *)(pp_Var2 + 4) = local_d8.function._0_4_;
  *(undefined4 *)((long)pp_Var2 + 0x24) = local_d8.function._4_4_;
  *(undefined4 *)(pp_Var2 + 5) = local_d8.init_local_state._0_4_;
  *(undefined4 *)((long)pp_Var2 + 0x2c) = local_d8.init_local_state._4_4_;
  *pp_Var2 = (_func_int *)&PTR__MapBoundCastData_0247f538;
  ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_> *)
  (pp_Var2 + 3))->super__Head_base<0UL,_duckdb::BoundCastData_*,_false> =
       (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)
       local_c0.cast_data.
       super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_> *)
  (pp_Var2 + 6))->super__Head_base<0UL,_duckdb::BoundCastData_*,_false> =
       (_Head_base<0UL,_duckdb::BoundCastData_*,_false>)
       local_d8.cast_data.
       super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  (this->super_BoundCastData)._vptr_BoundCastData = pp_Var2;
  local_c0.cast_data.
  super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
       (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
        )0x0;
  local_d8.cast_data.
  super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
       (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
        )0x0;
  LogicalType::~LogicalType(&local_90);
  LogicalType::~LogicalType(&local_78);
  LogicalType::~LogicalType(&local_60);
  LogicalType::~LogicalType(&local_48);
  ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector(&local_a8);
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)this;
}

Assistant:

unique_ptr<BoundCastData> MapBoundCastData::BindMapToMapCast(BindCastInput &input, const LogicalType &source,
                                                             const LogicalType &target) {
	vector<BoundCastInfo> child_cast_info;
	auto source_key = MapType::KeyType(source);
	auto target_key = MapType::KeyType(target);
	auto source_val = MapType::ValueType(source);
	auto target_val = MapType::ValueType(target);
	auto key_cast = input.GetCastFunction(source_key, target_key);
	auto value_cast = input.GetCastFunction(source_val, target_val);
	return make_uniq<MapBoundCastData>(std::move(key_cast), std::move(value_cast));
}